

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_ShmtWriter.cpp
# Opt level: O0

ssize_t __thiscall axl::io::ShmtWriter::write(ShmtWriter *this,int __fd,void *__buf,size_t __n)

{
  ShmtFileHdr *pSVar1;
  ShmtBase *sizeArray;
  char *count;
  uint32_t uVar2;
  void **blockArray;
  __sighandler_t __handler;
  Lock *__stat_loc;
  bool bVar3;
  ShmtMessageHdr *msgHdr;
  size_t writeEndOffset;
  size_t writeOffset;
  ScopeLock scopeLock;
  size_t writeSize;
  size_t i;
  size_t chainSize;
  bool result;
  Lock *in_stack_ffffffffffffff48;
  ShmtBase *in_stack_ffffffffffffff50;
  size_t in_stack_ffffffffffffff68;
  undefined8 in_stack_ffffffffffffff78;
  uint_t code;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  unsigned_long local_48;
  ulong local_40;
  unsigned_long local_38;
  unsigned_long local_8;
  
  local_38 = 0;
  for (local_40 = 0; local_40 < __n; local_40 = local_40 + 1) {
    local_38 = *(long *)((long)__buf + local_40 * 8) + local_38;
  }
  if (local_38 == 0) {
    return 0;
  }
  local_48 = local_38;
  if (((this->super_ShmtBase).m_flags & 0x10000) != 0) {
    local_48 = sl::align<8ul,unsigned_long>(local_38 + 8);
  }
  __stat_loc = &this->m_writeLock;
  sys::ScopeLock::ScopeLock((ScopeLock *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  sys::atomicLock((int32_t *)in_stack_ffffffffffffff50);
  if (((((this->super_ShmtBase).m_hdr)->m_dataSize != 0) &&
      (((this->super_ShmtBase).m_hdr)->m_writeOffset <= ((this->super_ShmtBase).m_hdr)->m_readOffset
      )) && ((ulong)((this->super_ShmtBase).m_hdr)->m_readOffset <
             ((this->super_ShmtBase).m_hdr)->m_writeOffset + local_48)) {
    while( true ) {
      code = (uint_t)((ulong)in_stack_ffffffffffffff78 >> 0x20);
      bVar3 = false;
      if (((((this->super_ShmtBase).m_hdr)->m_dataSize != 0) &&
          (bVar3 = false,
          ((this->super_ShmtBase).m_hdr)->m_writeOffset <=
          ((this->super_ShmtBase).m_hdr)->m_readOffset)) &&
         (bVar3 = false,
         (ulong)((this->super_ShmtBase).m_hdr)->m_readOffset <
         ((this->super_ShmtBase).m_hdr)->m_writeOffset + local_48)) {
        bVar3 = (((this->super_ShmtBase).m_hdr)->m_state & 4) == 0;
      }
      if (!bVar3) break;
      pSVar1 = (this->super_ShmtBase).m_hdr;
      pSVar1->m_readSemaphoreWaitCount = pSVar1->m_readSemaphoreWaitCount + 1;
      sys::atomicUnlock((int32_t *)in_stack_ffffffffffffff50);
      sys::NamedSemaphore::wait(&(this->super_ShmtBase).m_readSemaphore,__stat_loc);
      sys::atomicLock((int32_t *)in_stack_ffffffffffffff50);
    }
    if ((((this->super_ShmtBase).m_hdr)->m_state & 4) != 0) {
      sys::atomicUnlock((int32_t *)in_stack_ffffffffffffff50);
      err::ErrorRef::ErrorRef
                ((ErrorRef *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),code);
      err::setError((ErrorRef *)0x14b5cf);
      err::ErrorRef::~ErrorRef((ErrorRef *)0x14b5db);
      local_8 = 0xffffffffffffffff;
      goto LAB_0014b838;
    }
  }
  blockArray = (void **)(ulong)((this->super_ShmtBase).m_hdr)->m_writeOffset;
  sys::atomicUnlock((int32_t *)in_stack_ffffffffffffff50);
  sizeArray = (ShmtBase *)((long)blockArray + local_48);
  bVar3 = ShmtBase::ensureOffsetMapped(in_stack_ffffffffffffff50,(size_t)in_stack_ffffffffffffff48);
  if (bVar3) {
    if (((this->super_ShmtBase).m_flags & 0x10000) == 0) {
      copyWriteChain((void *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                     blockArray,(size_t *)sizeArray,in_stack_ffffffffffffff68);
    }
    else {
      count = (this->super_ShmtBase).m_data + (long)blockArray;
      count[0] = '\n';
      count[1] = 'm';
      count[2] = 's';
      count[3] = ':';
      *(undefined4 *)(count + 4) = (undefined4)local_38;
      copyWriteChain((void *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                     blockArray,(size_t *)sizeArray,(size_t)count);
    }
    sys::atomicLock((int32_t *)in_stack_ffffffffffffff50);
    uVar2 = (uint32_t)sizeArray;
    if ((((this->super_ShmtBase).m_hdr)->m_readOffset <
         ((this->super_ShmtBase).m_hdr)->m_writeOffset) ||
       (((this->super_ShmtBase).m_hdr)->m_dataSize == 0)) {
      if ((ShmtBase *)this->m_sizeLimitHint < sizeArray) {
        sizeArray = (ShmtBase *)0x0;
      }
      ((this->super_ShmtBase).m_hdr)->m_writeOffset = (uint32_t)sizeArray;
      ((this->super_ShmtBase).m_hdr)->m_endOffset = uVar2;
    }
    else {
      ((this->super_ShmtBase).m_hdr)->m_writeOffset = uVar2;
      sizeArray = in_stack_ffffffffffffff50;
    }
    pSVar1 = (this->super_ShmtBase).m_hdr;
    __handler = (__sighandler_t)(pSVar1->m_dataSize + local_38);
    pSVar1->m_dataSize = (uint32_t)__handler;
    if (((this->super_ShmtBase).m_hdr)->m_writeSemaphoreWaitCount != 0) {
      sys::NamedSemaphore::signal
                (&(this->super_ShmtBase).m_writeSemaphore,
                 ((this->super_ShmtBase).m_hdr)->m_writeSemaphoreWaitCount,__handler);
      ((this->super_ShmtBase).m_hdr)->m_writeSemaphoreWaitCount = 0;
    }
    sys::atomicUnlock((int32_t *)sizeArray);
    local_8 = local_38;
  }
  else {
    local_8 = 0xffffffffffffffff;
  }
LAB_0014b838:
  sys::ScopeLock::~ScopeLock((ScopeLock *)0x14b842);
  return local_8;
}

Assistant:

size_t
ShmtWriter::write(
	const void* const* blockArray,
	const size_t* sizeArray,
	size_t count
) {
	ASSERT(isOpen());

	bool result;

	size_t chainSize = 0;
	for (size_t i = 0; i < count; i++)
		chainSize += sizeArray[i];

	if (!chainSize)
		return 0;

	size_t writeSize = chainSize;

	if (m_flags & ShmtFlag_Message) {
		writeSize += sizeof(ShmtMessageHdr);
#if (_AXL_IO_SHMT_ALIGN_MESSAGES)
		writeSize = sl::align<AXL_PTR_SIZE> (writeSize);
#endif
	}

	sys::ScopeLock scopeLock(&m_writeLock); // ensure atomic write

	sys::atomicLock(&m_hdr->m_lock);

	// if buffer is wrapped, then wait until we have enough space

	if (m_hdr->m_dataSize &&
		m_hdr->m_writeOffset <= m_hdr->m_readOffset &&
		m_hdr->m_writeOffset + writeSize > m_hdr->m_readOffset) {
		while (
			m_hdr->m_dataSize &&
			m_hdr->m_writeOffset <= m_hdr->m_readOffset &&
			m_hdr->m_writeOffset + writeSize > m_hdr->m_readOffset &&
			!(m_hdr->m_state & ShmtState_Disconnected)) {
			m_hdr->m_readSemaphoreWaitCount++;
			sys::atomicUnlock(&m_hdr->m_lock);

			m_readSemaphore.wait();

			sys::atomicLock(&m_hdr->m_lock);
		}

		if (m_hdr->m_state & ShmtState_Disconnected) {
			sys::atomicUnlock(&m_hdr->m_lock);
			err::setError(err::SystemErrorCode_InvalidDeviceState);
			return -1;
		}
	}

	size_t writeOffset = m_hdr->m_writeOffset;

	sys::atomicUnlock(&m_hdr->m_lock);

	size_t writeEndOffset = writeOffset + writeSize;

	result = ensureOffsetMapped(writeEndOffset);
	if (!result)
		return -1;

	if (m_flags & ShmtFlag_Message) {
#if (_AXL_IO_SHMT_ALIGN_MESSAGES)
		ASSERT(sl::isAligned<AXL_PTR_SIZE> (writeOffset));
#endif

		ShmtMessageHdr* msgHdr = (ShmtMessageHdr*)(m_data + writeOffset);
		msgHdr->m_signature = ShmtConst_MessageSignature;
		msgHdr->m_size = chainSize;
		copyWriteChain(msgHdr + 1, blockArray, sizeArray, count);
	} else {
		copyWriteChain(m_data + writeOffset, blockArray, sizeArray, count);
	}

	sys::atomicLock(&m_hdr->m_lock);

	if (m_hdr->m_writeOffset <= m_hdr->m_readOffset && m_hdr->m_dataSize) { // wrapped
		m_hdr->m_writeOffset = writeEndOffset;
	} else {
		m_hdr->m_writeOffset = writeEndOffset > m_sizeLimitHint ? 0 : writeEndOffset;
		m_hdr->m_endOffset = writeEndOffset;
	}

	m_hdr->m_dataSize += chainSize;

	if (m_hdr->m_writeSemaphoreWaitCount) {
		m_writeSemaphore.signal(m_hdr->m_writeSemaphoreWaitCount);
		m_hdr->m_writeSemaphoreWaitCount = 0;
	}

	sys::atomicUnlock(&m_hdr->m_lock);

	return chainSize;
}